

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryImagesLoader14.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::LibraryImagesLoader14::begin__image(LibraryImagesLoader14 *this)

{
  image__AttributeData *in_RSI;
  
  begin__image((LibraryImagesLoader14 *)&this[-1].super_IParserImpl14.super_ColladaParserAutoGen14,
               in_RSI);
  return;
}

Assistant:

bool LibraryImagesLoader14::begin__image( const COLLADASaxFWL14::image__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__image(attributeData));
COLLADASaxFWL::image__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
attrData.sid = 0;
attrData.format = attributeData.format;
attrData.depth = attributeData.depth;
if ( (attributeData.present_attributes & COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT) == COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT ) {
    attrData.height = attributeData.height;
    attrData.present_attributes |= COLLADASaxFWL::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT) == COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT ) {
    attrData.width = attributeData.width;
    attrData.present_attributes |= COLLADASaxFWL::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT;
}
return mLoader->begin__image(attrData);
}